

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
::multiply_source_and_add_to
          (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
           *this,Field_element *coefficient,Index sourceColumnIndex,Index targetColumnIndex)

{
  Index local_3c;
  anon_class_32_4_b04cce49 local_38;
  
  local_3c = sourceColumnIndex;
  local_38.col = get_column(this,targetColumnIndex);
  local_38.sourceColumnIndex = &local_3c;
  local_38.this = this;
  local_38.coefficient = coefficient;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>
  ::
  _add_to<Gudhi::persistence_matrix::Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>::multiply_source_and_add_to(bool_const&,unsigned_int,unsigned_int)::_lambda()_1_>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>
              *)this,local_38.col,&local_38);
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::multiply_source_and_add_to(const Field_element& coefficient,
                                                                    Index sourceColumnIndex,
                                                                    Index targetColumnIndex)
{
  auto& col = get_column(targetColumnIndex);
  _add_to(col, [&]() { col.multiply_source_and_add(get_column(sourceColumnIndex), coefficient); });
}